

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tripeaks.c
# Opt level: O2

Board * tripeaks_boardCreate(Card **cards,unsigned_long cardsCount)

{
  Board *board;
  Spot *pSVar1;
  uchar spotIndex;
  long lVar2;
  
  board = board_create();
  pSVar1 = spot_create(STOCK,'\0');
  board_spotAdd(board,pSVar1);
  pSVar1 = spot_create(FOUNDATION,'\0');
  board_spotAdd(board,pSVar1);
  for (spotIndex = '\0'; spotIndex != '\x1c'; spotIndex = spotIndex + '\x01') {
    pSVar1 = spot_create(TABLEAU,spotIndex);
    board_spotAdd(board,pSVar1);
  }
  for (lVar2 = 0; lVar2 != 0x1c; lVar2 = lVar2 + 1) {
    board_cardAdd(board,TABLEAU,(uchar)lVar2,cards[lVar2]);
  }
  for (lVar2 = 0; lVar2 != 0x17; lVar2 = lVar2 + 1) {
    board_cardAdd(board,STOCK,'\0',cards[lVar2 + 0x1c]);
  }
  board_cardAdd(board,FOUNDATION,'\0',cards[0x33]);
  return board;
}

Assistant:

Board * tripeaks_boardCreate(Card ** cards, unsigned long cardsCount)
{
	Board * board = board_create();
	unsigned char i;

	board_spotAdd(board, spot_create(STOCK, 0));
	board_spotAdd(board, spot_create(FOUNDATION, 0));

	for(i=0;i<28;i++)
	{
		board_spotAdd(board, spot_create(TABLEAU, i));
	}

	for(i=0;i<28;i++)
	{
		board_cardAdd(board, TABLEAU, i, cards[i]);
	}
	for(;i<51;i++)
	{
		board_cardAdd(board, STOCK, 0, cards[i]);
	}

	board_cardAdd(board, FOUNDATION, 0, cards[i]);

	return board;
}